

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

ON_RenderContent * __thiscall ON_RenderContentPrivate::FindLastChild(ON_RenderContentPrivate *this)

{
  ON_RenderContent *local_20;
  ON_RenderContent *candidate;
  ON_RenderContent *result;
  ON_RenderContentPrivate *this_local;
  
  candidate = (ON_RenderContent *)0x0;
  for (local_20 = this->m_first_child; local_20 != (ON_RenderContent *)0x0;
      local_20 = local_20->_private->m_next_sibling) {
    candidate = local_20;
  }
  return candidate;
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::FindLastChild(void) const
{
  ON_RenderContent* result = nullptr;

  ON_RenderContent* candidate = m_first_child;
  while (nullptr != candidate)
  {
    result = candidate;
    candidate = candidate->_private->m_next_sibling;
  }

  return result;
}